

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utlru_cache.hpp
# Opt level: O1

void __thiscall
cappuccino::
utlru_cache<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(cappuccino::thread_safe)1>
::utlru_cache(utlru_cache<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(cappuccino::thread_safe)1>
              *this,milliseconds ttl,size_t capacity,float max_load_factor)

{
  list<unsigned_long,_std::allocator<unsigned_long>_> *this_00;
  _List_node_base *p_Var1;
  double dVar2;
  _List_node_base *p_Var3;
  _List_node_base *p_Var4;
  __hashtable *__this;
  undefined1 auVar5 [16];
  allocator_type local_36;
  allocator_type local_35;
  float local_34;
  
  *(undefined8 *)((long)&(this->m_lock).m_lock.super___mutex_base._M_mutex + 0x10) = 0;
  (this->m_lock).m_lock.super___mutex_base._M_mutex.__data.__list.__prev =
       (__pthread_internal_list *)0x0;
  (this->m_lock).m_lock.super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->m_lock).m_lock.super___mutex_base._M_mutex + 8) = 0;
  (this->m_lock).m_lock.super___mutex_base._M_mutex.__data.__list.__next =
       (__pthread_internal_list *)0x0;
  (this->m_ttl).__r = ttl.__r;
  this->m_used_size = 0;
  local_34 = max_load_factor;
  std::
  vector<cappuccino::utlru_cache<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(cappuccino::thread_safe)1>::element,_std::allocator<cappuccino::utlru_cache<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(cappuccino::thread_safe)1>::element>_>
  ::vector(&this->m_elements,capacity,&local_35);
  (this->m_keyed_elements)._M_h._M_buckets = &(this->m_keyed_elements)._M_h._M_single_bucket;
  (this->m_keyed_elements)._M_h._M_bucket_count = 1;
  (this->m_keyed_elements)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->m_keyed_elements)._M_h._M_element_count = 0;
  (this->m_keyed_elements)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->m_keyed_elements)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->m_keyed_elements)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  this_00 = &this->m_lru_list;
  std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>::list
            (this_00,capacity,&local_36);
  (this->m_ttl_list).super__List_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl._M_node
  .super__List_node_base._M_prev = (_List_node_base *)&this->m_ttl_list;
  (this->m_ttl_list).super__List_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl._M_node
  .super__List_node_base._M_next = (_List_node_base *)&this->m_ttl_list;
  (this->m_ttl_list).super__List_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl._M_node
  ._M_size = 0;
  (this->m_lru_end)._M_node = (_List_node_base *)0x0;
  p_Var1 = (this->m_lru_list).super__List_base<unsigned_long,_std::allocator<unsigned_long>_>.
           _M_impl._M_node.super__List_node_base._M_next;
  if (p_Var1 != (_List_node_base *)this_00) {
    p_Var3 = (_List_node_base *)0x0;
    p_Var4 = p_Var1;
    do {
      p_Var4[1]._M_next = p_Var3;
      p_Var3 = (_List_node_base *)((long)&p_Var3->_M_next + 1);
      p_Var4 = p_Var4->_M_next;
    } while (p_Var4 != (_List_node_base *)this_00);
  }
  (this->m_lru_end)._M_node = p_Var1;
  (this->m_keyed_elements)._M_h._M_rehash_policy._M_max_load_factor = local_34;
  auVar5._8_4_ = (int)(capacity >> 0x20);
  auVar5._0_8_ = capacity;
  auVar5._12_4_ = 0x45300000;
  (this->m_keyed_elements)._M_h._M_rehash_policy._M_next_resize = 0;
  dVar2 = ceil(((auVar5._8_8_ - 1.9342813113834067e+25) +
               ((double)CONCAT44(0x43300000,(int)capacity) - 4503599627370496.0)) / (double)local_34
              );
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::rehash(&(this->m_keyed_elements)._M_h,
           (long)(dVar2 - 9.223372036854776e+18) & (long)dVar2 >> 0x3f | (long)dVar2);
  return;
}

Assistant:

utlru_cache(std::chrono::milliseconds ttl, size_t capacity, float max_load_factor = 1.0f)
        : m_ttl(ttl),
          m_elements(capacity),
          m_lru_list(capacity)
    {
        std::iota(m_lru_list.begin(), m_lru_list.end(), 0);
        m_lru_end = m_lru_list.begin();

        m_keyed_elements.max_load_factor(max_load_factor);
        m_keyed_elements.reserve(capacity);
    }